

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

char * faup_output_get_string_from_url_type(faup_handler_t *fh)

{
  faup_handler_t *fh_local;
  
  switch((fh->faup).url_type) {
  case FAUP_URL_HAS_NO_TLD:
    fh_local = (faup_handler_t *)anon_var_dwarf_e32f;
    break;
  case FAUP_URL_HAS_MOZILLA_TLD:
    fh_local = (faup_handler_t *)anon_var_dwarf_e345;
    break;
  case FAUP_URL_HAS_UNKNOWN_TLD:
    fh_local = (faup_handler_t *)anon_var_dwarf_e35b;
    break;
  case FAUP_URL_IPV4:
    fh_local = (faup_handler_t *)anon_var_dwarf_e365;
    break;
  case FAUP_URL_IPV6:
    fh_local = (faup_handler_t *)anon_var_dwarf_e37b;
    break;
  default:
    fprintf(_stderr,
            "Woops, we should never be here: cannot guess the faup url type in the output!\n");
    fh_local = (faup_handler_t *)0x12f43f;
  }
  return (char *)fh_local;
}

Assistant:

char *faup_output_get_string_from_url_type(faup_handler_t const* fh)
{
  switch (fh->faup.url_type) {
  case FAUP_URL_HAS_NO_TLD:
    return "no_tld";
    break;
  case FAUP_URL_HAS_MOZILLA_TLD:
    return "mozilla_tld";
    break;
  case FAUP_URL_HAS_UNKNOWN_TLD:
    return "unknown_tld";
    break;
  case FAUP_URL_IPV4:
    return "ipv4";
    break;
  case FAUP_URL_IPV6:
    return "ipv6";
    break;
  default:
    fprintf(stderr, "Woops, we should never be here: cannot guess the faup url type in the output!\n");
    return "error";
    break;
  }

    return "error";
}